

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
TypedExpectation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
::TypedExpectation(TypedExpectation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                   *this,FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                         *owner,char *a_file,int a_line,string *a_source_text,
                  ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00164438;
  this->owner_ = owner;
  Matcher<int>::Matcher((Matcher<int> *)&this->matchers_,(Matcher<int> *)m);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<int>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<int>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<int>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<int>_&>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00164480;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}